

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

FUNCTION_RETURN verifySignature(char *stringToVerify,char *signatureB64)

{
  uint uVar1;
  int iVar2;
  BIO *pBVar3;
  RSA *key;
  EVP_PKEY *pkey;
  BIO_METHOD *type;
  size_t sVar4;
  BIO *append;
  EVP_MD_CTX *ctx;
  EVP_MD *type_00;
  int *piVar5;
  FUNCTION_RETURN FVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double dVar7;
  uchar buffer [512];
  uchar auStack_238 [520];
  
  pBVar3 = BIO_new_mem_buf("-----BEGIN RSA PUBLIC KEY-----\nMIGJAoGBALoxrp8s1zrb7GHpIuRBb7bSz9toGZ+dRtMZWnMP+QfkLeROWM1NdZrS\ndArdpblRzaXw5wcarTxYOI5TVP2BBWksVth4qDKs+aLUYrinf+K+ou5zmENF76ZA\nAYzw+sVzG0lGdW0RgQZ77uCd2Dd2rlTDqcxtzjafMtKdp4oKwIbxAgMBAAE=\n-----END RSA PUBLIC KEY-----\n"
                           ,0xfb);
  key = PEM_read_bio_RSAPublicKey(pBVar3,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
  BIO_free(pBVar3);
  if (key == (RSA *)0x0) {
    piVar5 = __errno_location();
    dVar7 = extraout_XMM0_Qa_01;
    if (*piVar5 != 0) {
      strerror(*piVar5);
      dVar7 = extraout_XMM0_Qa_02;
    }
  }
  else {
    pkey = EVP_PKEY_new();
    EVP_PKEY_assign(pkey,6,key);
    type = BIO_f_base64();
    pBVar3 = BIO_new(type);
    sVar4 = strlen(signatureB64);
    append = BIO_new_mem_buf(signatureB64,(int)sVar4);
    pBVar3 = BIO_push(pBVar3,append);
    BIO_set_flags(pBVar3,0x100);
    sVar4 = strlen(signatureB64);
    uVar1 = BIO_read(pBVar3,auStack_238,(int)sVar4);
    auStack_238[uVar1] = '\0';
    BIO_free_all(pBVar3);
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx != (EVP_MD_CTX *)0x0) {
      type_00 = EVP_sha256();
      iVar2 = EVP_DigestVerifyInit(ctx,(EVP_PKEY_CTX **)0x0,type_00,(ENGINE *)0x0,pkey);
      if (iVar2 == 1) {
        sVar4 = strlen(stringToVerify);
        iVar2 = EVP_DigestVerifyUpdate(ctx,stringToVerify,(long)(int)sVar4);
        if (iVar2 == 1) {
          iVar2 = EVP_DigestVerifyFinal(ctx,auStack_238,(ulong)uVar1);
          FVar6 = FUNC_RET_OK;
          if (iVar2 != 1) {
            piVar5 = __errno_location();
            dVar7 = extraout_XMM0_Qa;
            if (*piVar5 != 0) {
              strerror(*piVar5);
              dVar7 = extraout_XMM0_Qa_00;
            }
            _log(dVar7);
            FVar6 = FUNC_RET_ERROR;
          }
          if (pkey != (EVP_PKEY *)0x0) {
            EVP_PKEY_free(pkey);
          }
          EVP_MD_CTX_free(ctx);
          return FVar6;
        }
        piVar5 = __errno_location();
        dVar7 = extraout_XMM0_Qa_07;
        if (*piVar5 != 0) {
          strerror(*piVar5);
          dVar7 = extraout_XMM0_Qa_08;
        }
        _log(dVar7);
      }
      else {
        piVar5 = __errno_location();
        dVar7 = extraout_XMM0_Qa_05;
        if (*piVar5 != 0) {
          strerror(*piVar5);
          dVar7 = extraout_XMM0_Qa_06;
        }
        _log(dVar7);
      }
      if (pkey != (EVP_PKEY *)0x0) {
        EVP_PKEY_free(pkey);
      }
      EVP_MD_CTX_free(ctx);
      return FUNC_RET_ERROR;
    }
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
    piVar5 = __errno_location();
    dVar7 = extraout_XMM0_Qa_03;
    if (*piVar5 != 0) {
      strerror(*piVar5);
      dVar7 = extraout_XMM0_Qa_04;
    }
  }
  _log(dVar7);
  return FUNC_RET_ERROR;
}

Assistant:

FUNCTION_RETURN verifySignature(const char* stringToVerify,
		const char* signatureB64) {
	EVP_MD_CTX *mdctx = NULL;
	const char *pubKey = PUBLIC_KEY;
	int func_ret = 0;

	BIO* bio = BIO_new_mem_buf((void*) (pubKey), strlen(pubKey));
	RSA *rsa = PEM_read_bio_RSAPublicKey(bio, NULL, NULL, NULL);
	BIO_free(bio);
	if (rsa == NULL) {
		LOG_ERROR("Error reading public key");
		return FUNC_RET_ERROR;
	}
	EVP_PKEY *pkey = EVP_PKEY_new();
	EVP_PKEY_assign_RSA(pkey, rsa);

	/*BIO* bo = BIO_new(BIO_s_mem());
	 BIO_write(bo, pubKey, strlen(pubKey));
	 RSA *key = 0;
	 PEM_read_bio_RSAPublicKey(bo, &key, 0, 0);
	 BIO_free(bo);*/

//RSA* rsa = EVP_PKEY_get1_RSA( key );
//RSA * pubKey = d2i_RSA_PUBKEY(NULL, <der encoded byte stream pointer>, <num bytes>);
	unsigned char buffer[512];
	BIO* b64 = BIO_new(BIO_f_base64());
	BIO* encoded_signature = BIO_new_mem_buf((void *) signatureB64,
			strlen(signatureB64));
	BIO* biosig = BIO_push(b64, encoded_signature);
	BIO_set_flags(biosig, BIO_FLAGS_BASE64_NO_NL); //Do not use newlines to flush buffer
	unsigned int len = BIO_read(biosig, (void *) buffer, strlen(signatureB64));
//Can test here if len == decodeLen - if not, then return an error
	buffer[len] = 0;

	BIO_free_all(biosig);

	/* Create the Message Digest Context */
	if (!(mdctx = EVP_MD_CTX_create())) {
		free_resources(pkey, mdctx);
		LOG_ERROR("Error creating context");
		return FUNC_RET_ERROR;
	}
	if (1 != EVP_DigestVerifyInit(mdctx, NULL, EVP_sha256(), NULL, pkey)) {
		LOG_ERROR("Error initializing digest");
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}
	int en = strlen(stringToVerify);
	func_ret = EVP_DigestVerifyUpdate(mdctx, stringToVerify, en);
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}
	FUNCTION_RETURN result;
	func_ret = EVP_DigestVerifyFinal(mdctx, buffer, len);
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
	}
	result = (1 == func_ret ? FUNC_RET_OK : FUNC_RET_ERROR);

	free_resources(pkey, mdctx);
	return result;
}